

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_dictContentType_e dictContentType;
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  ZSTD_allocFunction p_Var4;
  ZSTD_freeFunction p_Var5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ZSTD_customMem cMem;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params params;
  ZSTD_CCtx_params params_00;
  ZSTD_cStreamStage ZVar18;
  size_t sVar19;
  ZSTD_CDict *pZVar20;
  ZSTDMT_CCtx *pZVar21;
  long lVar22;
  void *pvVar23;
  ulong uVar24;
  size_t sVar25;
  ulong uVar26;
  undefined8 *puVar27;
  undefined8 *puVar28;
  void *src;
  unsigned_long_long pledgedSrcSize;
  uint nbWorkers;
  char *dst;
  uint uVar29;
  char *pcVar30;
  char *dst_00;
  size_t err_code;
  ulong uVar31;
  bool bVar32;
  byte bVar33;
  uint in_stack_fffffffffffffd18;
  uint in_stack_fffffffffffffd1c;
  uint in_stack_fffffffffffffd20;
  uint in_stack_fffffffffffffd24;
  uint in_stack_fffffffffffffd28;
  uint in_stack_fffffffffffffd2c;
  ZSTD_strategy in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  ZSTD_allocFunction in_stack_fffffffffffffd38;
  ZSTD_freeFunction in_stack_fffffffffffffd40;
  void *in_stack_fffffffffffffd48;
  undefined1 auVar34 [24];
  undefined1 in_stack_fffffffffffffd50 [88];
  undefined1 auVar35 [24];
  undefined1 local_208 [8];
  uint uStack_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  ZSTD_strategy ZStack_1f0;
  undefined4 uStack_1ec;
  undefined8 local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined8 uStack_1c4;
  ZSTD_compressionParameters local_1b8;
  size_t local_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 local_178;
  ZSTD_allocFunction p_Stack_170;
  ZSTD_freeFunction p_Stack_168;
  void *pvStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined4 uStack_130;
  undefined4 local_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined8 uStack_114;
  uint local_10c;
  size_t local_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  ZSTD_allocFunction p_Stack_e0;
  ZSTD_freeFunction p_Stack_d8;
  void *pvStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined4 uStack_a0;
  undefined4 local_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  uint local_7c;
  size_t local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  ZSTD_allocFunction p_Stack_50;
  ZSTD_freeFunction p_Stack_48;
  void *pvStack_40;
  
  bVar33 = 0;
  if (output->size < output->pos) {
    return 0xffffffffffffffff;
  }
  if (input->size < input->pos) {
    return 0xffffffffffffffff;
  }
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx!=NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x39a7,
                  "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  ZVar18 = cctx->streamStage;
  if (ZVar18 == zcss_init) {
    uVar6 = (cctx->requestedParams).format;
    uVar7 = (cctx->requestedParams).cParams.windowLog;
    uVar8 = (cctx->requestedParams).cParams.chainLog;
    uVar9 = (cctx->requestedParams).cParams.hashLog;
    uVar10 = (cctx->requestedParams).cParams.searchLog;
    uVar11 = (cctx->requestedParams).cParams.minMatch;
    uVar12 = (cctx->requestedParams).cParams.targetLength;
    uVar13 = (cctx->requestedParams).cParams.strategy;
    local_1e8._0_4_ = (cctx->requestedParams).fParams.contentSizeFlag;
    local_1e8._4_4_ = (cctx->requestedParams).fParams.checksumFlag;
    uVar14 = (cctx->requestedParams).compressionLevel;
    uVar15 = (cctx->requestedParams).forceWindow;
    uVar16 = *(undefined8 *)&(cctx->requestedParams).field_0x34;
    uVar17 = *(undefined8 *)((long)&(cctx->requestedParams).targetCBlockSize + 4);
    uStack_1c4._0_4_ = (cctx->requestedParams).attachDictPref;
    uStack_1c4._4_4_ = (cctx->requestedParams).literalCompressionMode;
    uStack_1e0 = (undefined4)*(undefined8 *)&(cctx->requestedParams).fParams.noDictIDFlag;
    uStack_1d4 = (undefined4)uVar16;
    uStack_1d0 = (undefined4)((ulong)uVar16 >> 0x20);
    uStack_1cc = (undefined4)uVar17;
    uStack_1c8 = (undefined4)((ulong)uVar17 >> 0x20);
    uVar29 = (cctx->requestedParams).nbWorkers;
    local_178._0_4_ = (cctx->requestedParams).ldmParams.hashRateLog;
    local_178._4_4_ = (cctx->requestedParams).ldmParams.windowLog;
    p_Stack_170 = (cctx->requestedParams).customMem.customAlloc;
    p_Stack_168 = (cctx->requestedParams).customMem.customFree;
    pvStack_160 = (cctx->requestedParams).customMem.opaque;
    local_198 = (cctx->requestedParams).jobSize;
    uStack_190._0_4_ = (cctx->requestedParams).overlapLog;
    uStack_190._4_4_ = (cctx->requestedParams).rsyncable;
    uStack_188._0_4_ = (cctx->requestedParams).ldmParams.enableLdm;
    uStack_188._4_4_ = (cctx->requestedParams).ldmParams.hashLog;
    uStack_180._0_4_ = (cctx->requestedParams).ldmParams.bucketSizeLog;
    uStack_180._4_4_ = (cctx->requestedParams).ldmParams.minMatchLength;
    pvVar1 = (cctx->prefixDict).dict;
    sVar19 = (cctx->prefixDict).dictSize;
    dictContentType = (cctx->prefixDict).dictContentType;
    local_208._0_4_ = uVar6;
    local_208._4_4_ = uVar7;
    uStack_200 = uVar8;
    uStack_1fc = uVar9;
    uStack_1f8 = uVar10;
    uStack_1f4 = uVar11;
    ZStack_1f0 = uVar12;
    uStack_1ec = uVar13;
    uStack_1dc = uVar14;
    uStack_1d8 = uVar15;
    ZSTD_getCParamsFromCCtxParams
              (&local_1b8,&cctx->requestedParams,0xffffffffffffffff,(cctx->localDict).dictSize);
    pvVar2 = (cctx->localDict).dict;
    if (pvVar2 == (void *)0x0) {
      if ((cctx->localDict).dictBuffer != (void *)0x0) {
        __assert_fail("dl->dictBuffer == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2da6,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
      if ((cctx->localDict).cdict != (ZSTD_CDict *)0x0) {
        __assert_fail("dl->cdict == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2da7,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
      if ((cctx->localDict).dictSize != 0) {
        __assert_fail("dl->dictSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2da8,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
    }
    else {
      pZVar20 = (cctx->localDict).cdict;
      if (pZVar20 == (ZSTD_CDict *)0x0) {
        sVar25 = (cctx->localDict).dictSize;
        if (sVar25 == 0) {
          __assert_fail("dl->dictSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2db0,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
        }
        if (cctx->cdict != (ZSTD_CDict *)0x0) {
          __assert_fail("cctx->cdict == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2db1,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
        }
        if ((cctx->prefixDict).dict != (void *)0x0) {
          __assert_fail("cctx->prefixDict.dict == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2db2,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
        }
        in_stack_fffffffffffffd48 = (cctx->customMem).opaque;
        in_stack_fffffffffffffd38 = (cctx->customMem).customAlloc;
        in_stack_fffffffffffffd40 = (cctx->customMem).customFree;
        in_stack_fffffffffffffd2c = local_1b8.targetLength;
        in_stack_fffffffffffffd30 = local_1b8.strategy;
        in_stack_fffffffffffffd18 = local_1b8.windowLog;
        in_stack_fffffffffffffd1c = local_1b8.chainLog;
        cParams.hashLog = local_1b8.hashLog;
        cParams.windowLog = local_1b8.windowLog;
        cParams.chainLog = local_1b8.chainLog;
        cParams.searchLog = local_1b8.searchLog;
        cParams.minMatch = local_1b8.minMatch;
        cParams.targetLength = in_stack_fffffffffffffd2c;
        cParams.strategy = in_stack_fffffffffffffd30;
        pZVar20 = ZSTD_createCDict_advanced
                            (pvVar2,sVar25,ZSTD_dlm_byRef,(cctx->localDict).dictContentType,cParams,
                             cctx->customMem);
        (cctx->localDict).cdict = pZVar20;
        if (pZVar20 == (ZSTD_CDict *)0x0) {
          return 0xffffffffffffffc0;
        }
        cctx->cdict = pZVar20;
        in_stack_fffffffffffffd20 = local_1b8.hashLog;
        in_stack_fffffffffffffd24 = local_1b8.searchLog;
        in_stack_fffffffffffffd28 = local_1b8.minMatch;
      }
      else if (cctx->cdict != pZVar20) {
        __assert_fail("cctx->cdict == dl->cdict",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2dac,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
    }
    (cctx->prefixDict).dict = (void *)0x0;
    (cctx->prefixDict).dictSize = 0;
    *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
    if ((pvVar1 != (void *)0x0) && (cctx->cdict != (ZSTD_CDict *)0x0)) {
      __assert_fail("prefixDict.dict==NULL || cctx->cdict==NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x39af,
                    "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    if (endOp == ZSTD_e_end) {
      sVar25 = input->size;
      cctx->pledgedSrcSizePlusOne = sVar25 + 1;
    }
    else {
      sVar25 = cctx->pledgedSrcSizePlusOne - 1;
    }
    ZSTD_getCParamsFromCCtxParams
              ((ZSTD_compressionParameters *)(local_208 + 4),&cctx->requestedParams,sVar25,0);
    pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
    nbWorkers = 0;
    if (0x100000 < pledgedSrcSize) {
      nbWorkers = uVar29;
    }
    if ((int)nbWorkers < 1) {
      pZVar20 = cctx->cdict;
      uStack_118 = uStack_1c8;
      uStack_114 = uStack_1c4;
      uStack_138 = local_1e8;
      uStack_130 = uStack_1e0;
      local_12c = uStack_1dc;
      uStack_128 = uStack_1d8;
      uStack_124 = uStack_1d4;
      uStack_120 = uStack_1d0;
      uStack_11c = uStack_1cc;
      local_158 = CONCAT44(local_208._4_4_,local_208._0_4_);
      uStack_150 = CONCAT44(uStack_1fc,uStack_200);
      uStack_148 = CONCAT44(uStack_1f4,uStack_1f8);
      uStack_140 = CONCAT44(uStack_1ec,ZStack_1f0);
      local_10c = nbWorkers;
      local_108 = local_198;
      uStack_100 = uStack_190;
      uStack_f8 = uStack_188;
      uStack_f0 = uStack_180;
      local_e8 = local_178;
      p_Stack_e0 = p_Stack_170;
      p_Stack_d8 = p_Stack_168;
      pvStack_d0 = pvStack_160;
      puVar27 = &local_158;
      puVar28 = (undefined8 *)&stack0xfffffffffffffd18;
      for (lVar22 = 0x12; lVar22 != 0; lVar22 = lVar22 + -1) {
        *puVar28 = *puVar27;
        puVar27 = puVar27 + (ulong)bVar33 * -2 + 1;
        puVar28 = puVar28 + (ulong)bVar33 * -2 + 1;
      }
      params_00.cParams.windowLog = in_stack_fffffffffffffd1c;
      params_00.format = in_stack_fffffffffffffd18;
      params_00.cParams.chainLog = in_stack_fffffffffffffd20;
      params_00.cParams.hashLog = in_stack_fffffffffffffd24;
      params_00.cParams.searchLog = in_stack_fffffffffffffd28;
      params_00.cParams.minMatch = in_stack_fffffffffffffd2c;
      params_00.cParams.targetLength = in_stack_fffffffffffffd30;
      params_00.cParams.strategy = in_stack_fffffffffffffd34;
      params_00.fParams._0_8_ = in_stack_fffffffffffffd38;
      params_00._40_8_ = in_stack_fffffffffffffd40;
      params_00._48_8_ = in_stack_fffffffffffffd48;
      auVar34 = in_stack_fffffffffffffd50._40_24_;
      auVar35 = in_stack_fffffffffffffd50._64_24_;
      params_00.targetCBlockSize = in_stack_fffffffffffffd50._0_8_;
      params_00.srcSizeHint = in_stack_fffffffffffffd50._8_4_;
      params_00.attachDictPref = in_stack_fffffffffffffd50._12_4_;
      params_00.literalCompressionMode = in_stack_fffffffffffffd50._16_4_;
      params_00.nbWorkers = in_stack_fffffffffffffd50._20_4_;
      params_00.jobSize = in_stack_fffffffffffffd50._24_8_;
      params_00.overlapLog = in_stack_fffffffffffffd50._32_4_;
      params_00.rsyncable = in_stack_fffffffffffffd50._36_4_;
      params_00.ldmParams.enableLdm = auVar34._0_4_;
      params_00.ldmParams.hashLog = auVar34._4_4_;
      params_00.ldmParams.bucketSizeLog = auVar34._8_4_;
      params_00.ldmParams.minMatchLength = auVar34._12_4_;
      params_00.ldmParams.hashRateLog = auVar34._16_4_;
      params_00.ldmParams.windowLog = auVar34._20_4_;
      params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar35._0_8_;
      params_00.customMem.customFree = (ZSTD_freeFunction)auVar35._8_8_;
      params_00.customMem.opaque = (void *)auVar35._16_8_;
      sVar19 = ZSTD_resetCStream_internal
                         (cctx,pvVar1,sVar19,dictContentType,pZVar20,params_00,pledgedSrcSize);
      if (0xffffffffffffff88 < sVar19) {
        return sVar19;
      }
      if (cctx->streamStage != zcss_load) {
        __assert_fail("cctx->streamStage == zcss_load",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x39d0,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      uVar29 = 0;
      if ((cctx->appliedParams).nbWorkers != 0) {
        __assert_fail("cctx->appliedParams.nbWorkers == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x39d1,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
    }
    else {
      pZVar21 = cctx->mtctx;
      if (pZVar21 == (ZSTDMT_CCtx *)0x0) {
        pvVar2 = (cctx->customMem).opaque;
        in_stack_fffffffffffffd28 = (uint)pvVar2;
        in_stack_fffffffffffffd2c = (uint)((ulong)pvVar2 >> 0x20);
        p_Var4 = (cctx->customMem).customAlloc;
        p_Var5 = (cctx->customMem).customFree;
        in_stack_fffffffffffffd18 = (uint)p_Var4;
        in_stack_fffffffffffffd1c = (uint)((ulong)p_Var4 >> 0x20);
        in_stack_fffffffffffffd20 = (uint)p_Var5;
        in_stack_fffffffffffffd24 = (uint)((ulong)p_Var5 >> 0x20);
        cMem.customFree._4_4_ = in_stack_fffffffffffffd24;
        cMem._0_12_ = *(undefined1 (*) [12])&cctx->customMem;
        cMem.opaque._0_4_ = in_stack_fffffffffffffd28;
        cMem.opaque._4_4_ = in_stack_fffffffffffffd2c;
        pZVar21 = ZSTDMT_createCCtx_advanced(nbWorkers,cMem);
        cctx->mtctx = pZVar21;
        if (pZVar21 == (ZSTDMT_CCtx *)0x0) {
          return 0xffffffffffffffc0;
        }
        pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
      }
      pZVar20 = cctx->cdict;
      uStack_88 = uStack_1c8;
      uStack_84 = uStack_1c4;
      uStack_a8 = local_1e8;
      uStack_a0 = uStack_1e0;
      local_9c = uStack_1dc;
      uStack_98 = uStack_1d8;
      uStack_94 = uStack_1d4;
      uStack_90 = uStack_1d0;
      uStack_8c = uStack_1cc;
      local_c8 = CONCAT44(local_208._4_4_,local_208._0_4_);
      uStack_c0 = CONCAT44(uStack_1fc,uStack_200);
      uStack_b8 = CONCAT44(uStack_1f4,uStack_1f8);
      uStack_b0 = CONCAT44(uStack_1ec,ZStack_1f0);
      local_7c = nbWorkers;
      local_78 = local_198;
      uStack_70 = uStack_190;
      uStack_68 = uStack_188;
      uStack_60 = uStack_180;
      local_58 = local_178;
      p_Stack_50 = p_Stack_170;
      p_Stack_48 = p_Stack_168;
      pvStack_40 = pvStack_160;
      puVar27 = &local_c8;
      puVar28 = (undefined8 *)&stack0xfffffffffffffd18;
      for (lVar22 = 0x12; lVar22 != 0; lVar22 = lVar22 + -1) {
        *puVar28 = *puVar27;
        puVar27 = puVar27 + (ulong)bVar33 * -2 + 1;
        puVar28 = puVar28 + (ulong)bVar33 * -2 + 1;
      }
      params.cParams.windowLog = in_stack_fffffffffffffd1c;
      params.format = in_stack_fffffffffffffd18;
      params.cParams.chainLog = in_stack_fffffffffffffd20;
      params.cParams.hashLog = in_stack_fffffffffffffd24;
      params.cParams.searchLog = in_stack_fffffffffffffd28;
      params.cParams.minMatch = in_stack_fffffffffffffd2c;
      params.cParams.targetLength = in_stack_fffffffffffffd30;
      params.cParams.strategy = in_stack_fffffffffffffd34;
      params.fParams._0_8_ = in_stack_fffffffffffffd38;
      params._40_8_ = in_stack_fffffffffffffd40;
      params._48_8_ = in_stack_fffffffffffffd48;
      auVar34 = in_stack_fffffffffffffd50._40_24_;
      auVar35 = in_stack_fffffffffffffd50._64_24_;
      params.targetCBlockSize = in_stack_fffffffffffffd50._0_8_;
      params.srcSizeHint = in_stack_fffffffffffffd50._8_4_;
      params.attachDictPref = in_stack_fffffffffffffd50._12_4_;
      params.literalCompressionMode = in_stack_fffffffffffffd50._16_4_;
      params.nbWorkers = in_stack_fffffffffffffd50._20_4_;
      params.jobSize = in_stack_fffffffffffffd50._24_8_;
      params.overlapLog = in_stack_fffffffffffffd50._32_4_;
      params.rsyncable = in_stack_fffffffffffffd50._36_4_;
      params.ldmParams.enableLdm = auVar34._0_4_;
      params.ldmParams.hashLog = auVar34._4_4_;
      params.ldmParams.bucketSizeLog = auVar34._8_4_;
      params.ldmParams.minMatchLength = auVar34._12_4_;
      params.ldmParams.hashRateLog = auVar34._16_4_;
      params.ldmParams.windowLog = auVar34._20_4_;
      params.customMem.customAlloc = (ZSTD_allocFunction)auVar35._0_8_;
      params.customMem.customFree = (ZSTD_freeFunction)auVar35._8_8_;
      params.customMem.opaque = (void *)auVar35._16_8_;
      sVar19 = ZSTDMT_initCStream_internal
                         (pZVar21,pvVar1,sVar19,ZSTD_dct_rawContent,pZVar20,params,pledgedSrcSize);
      if (0xffffffffffffff88 < sVar19) {
        return sVar19;
      }
      cctx->streamStage = zcss_load;
      (cctx->appliedParams).nbWorkers = nbWorkers;
    }
    ZVar18 = zcss_load;
  }
  else {
    uVar29 = (cctx->appliedParams).nbWorkers;
  }
  if (0 < (int)uVar29) {
    if (ZSTD_e_end < endOp) {
      __assert_fail("forceMaxProgress || endOp == ZSTD_e_continue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x39da,
                    "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    if (cctx->cParamsChanged != 0) {
      pZVar21 = cctx->mtctx;
      uVar29 = (pZVar21->params).cParams.windowLog;
      (pZVar21->params).compressionLevel = (cctx->requestedParams).compressionLevel;
      ZSTD_getCParamsFromCCtxParams
                ((ZSTD_compressionParameters *)local_208,&cctx->requestedParams,0xffffffffffffffff,0
                );
      (pZVar21->params).cParams.searchLog = uStack_1fc;
      (pZVar21->params).cParams.minMatch = uStack_1f8;
      (pZVar21->params).cParams.targetLength = uStack_1f4;
      (pZVar21->params).cParams.strategy = ZStack_1f0;
      (pZVar21->params).cParams.windowLog = uVar29;
      (pZVar21->params).cParams.chainLog = local_208._4_4_;
      (pZVar21->params).cParams.hashLog = uStack_200;
      (pZVar21->params).cParams.searchLog = uStack_1fc;
      cctx->cParamsChanged = 0;
      local_208._0_4_ = uVar29;
    }
    while( true ) {
      sVar19 = ZSTDMT_compressStream_generic(cctx->mtctx,output,input,endOp);
      if ((0xffffffffffffff88 < sVar19) || (endOp == ZSTD_e_end && sVar19 == 0)) {
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
        return sVar19;
      }
      if (endOp + ~ZSTD_e_end < 0xfffffffe) {
        return sVar19;
      }
      if (sVar19 == 0) break;
      if (output->size <= output->pos) {
        if (output->pos != output->size) {
          __assert_fail("!forceMaxProgress || flushMin == 0 || output->pos == output->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x39eb,
                        "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        return sVar19;
      }
    }
    return 0;
  }
  if (cctx->inBuff == (char *)0x0) {
    __assert_fail("zcs->inBuff != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x390d,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (cctx->inBuffSize == 0) {
    __assert_fail("zcs->inBuffSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x390e,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (cctx->outBuff == (char *)0x0) {
    __assert_fail("zcs->outBuff != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x390f,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (cctx->outBuffSize == 0) {
    __assert_fail("zcs->outBuffSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3910,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (output->size < output->pos) {
    __assert_fail("output->pos <= output->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3911,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (input->size < input->pos) {
    __assert_fail("input->pos <= input->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3912,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  pvVar1 = input->src;
  pvVar23 = (void *)(input->size + (long)pvVar1);
  src = (void *)(input->pos + (long)pvVar1);
  pvVar2 = output->dst;
  pcVar30 = (char *)(output->size + (long)pvVar2);
  dst = (char *)(output->pos + (long)pvVar2);
LAB_0015036d:
  do {
    if (ZVar18 == zcss_load) {
      if (endOp == ZSTD_e_end) {
        uVar31 = (long)pvVar23 - (long)src;
        uVar26 = (ulong)(0x20000U - (int)uVar31 >> 0xb);
        if (0x1ffff < uVar31) {
          uVar26 = 0;
        }
        sVar19 = cctx->inBuffPos;
        if (sVar19 != 0 || (ulong)((long)pcVar30 - (long)dst) < uVar26 + (uVar31 >> 8) + uVar31)
        goto LAB_00150410;
        uVar31 = ZSTD_compressEnd(cctx,dst,(long)pcVar30 - (long)dst,src,uVar31);
        if (0xffffffffffffff88 < uVar31) {
          return uVar31;
        }
        cctx->frameEnded = 1;
LAB_00150a5f:
        dst = dst + uVar31;
        src = pvVar23;
LAB_00150a67:
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
LAB_00150a7f:
        input->pos = (long)src - (long)pvVar1;
        output->pos = (long)dst - (long)pvVar2;
        if (cctx->frameEnded == 0) {
          sVar19 = cctx->inBuffTarget - cctx->inBuffPos;
          if (sVar19 == 0) {
            sVar19 = cctx->blockSize;
          }
          if (0xffffffffffffff88 < sVar19) {
            return sVar19;
          }
        }
        return cctx->outBuffContentSize - cctx->outBuffFlushedSize;
      }
      sVar19 = cctx->inBuffPos;
      uVar31 = (long)pvVar23 - (long)src;
LAB_00150410:
      uVar26 = cctx->inBuffTarget - sVar19;
      if (uVar31 <= uVar26) {
        uVar26 = uVar31;
      }
      if (uVar26 != 0) {
        memcpy(cctx->inBuff + sVar19,src,uVar26);
        sVar19 = cctx->inBuffPos;
      }
      uVar31 = sVar19 + uVar26;
      cctx->inBuffPos = uVar31;
      src = (void *)((long)src + uVar26);
      if (endOp == ZSTD_e_flush) {
        if (uVar31 == cctx->inToCompress) goto LAB_00150a7f;
      }
      else if ((endOp == ZSTD_e_continue) && (uVar31 < cctx->inBuffTarget)) goto LAB_00150a7f;
      sVar19 = uVar31 - cctx->inToCompress;
      uVar26 = (long)pcVar30 - (long)dst;
      uVar31 = (ulong)(0x20000U - (int)sVar19 >> 0xb);
      if (0x1ffff < sVar19) {
        uVar31 = 0;
      }
      sVar25 = uVar26;
      dst_00 = dst;
      if (uVar26 < uVar31 + (sVar19 >> 8) + sVar19) {
        dst_00 = cctx->outBuff;
        sVar25 = cctx->outBuffSize;
      }
      if (endOp == ZSTD_e_end && src == pvVar23) {
        uVar31 = ZSTD_compressEnd(cctx,dst_00,sVar25,cctx->inBuff + cctx->inToCompress,sVar19);
      }
      else {
        uVar31 = ZSTD_compressContinue_internal
                           (cctx,dst_00,sVar25,cctx->inBuff + cctx->inToCompress,sVar19,1,0);
      }
      if (0xffffffffffffff88 < uVar31) {
        return uVar31;
      }
      uVar29 = (uint)(endOp == ZSTD_e_end && src == pvVar23);
      cctx->frameEnded = uVar29;
      sVar19 = cctx->inBuffPos;
      uVar3 = cctx->blockSize;
      uVar24 = uVar3 + sVar19;
      cctx->inBuffTarget = uVar24;
      if (cctx->inBuffSize < uVar24) {
        cctx->inBuffPos = 0;
        cctx->inBuffTarget = uVar3;
        sVar19 = 0;
        uVar24 = uVar3;
      }
      if (uVar29 == 0) {
        if (cctx->inBuffSize < uVar24) {
          __assert_fail("zcs->inBuffTarget <= zcs->inBuffSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3955,
                        "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                       );
        }
        cctx->inToCompress = sVar19;
        if (dst_00 == dst) {
          dst = dst + uVar31;
          ZVar18 = cctx->streamStage;
          goto LAB_0015036d;
        }
      }
      else {
        cctx->inToCompress = sVar19;
        if (dst_00 == dst) goto LAB_00150a5f;
      }
      cctx->outBuffContentSize = uVar31;
      cctx->outBuffFlushedSize = 0;
      cctx->streamStage = zcss_flush;
      sVar19 = 0;
    }
    else {
      if (ZVar18 != zcss_flush) {
        if (ZVar18 != zcss_init) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3981,
                        "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                       );
        }
        return 0xffffffffffffffc2;
      }
      uVar31 = cctx->outBuffContentSize;
      sVar19 = cctx->outBuffFlushedSize;
      uVar26 = (long)pcVar30 - (long)dst;
    }
    uVar31 = uVar31 - sVar19;
    uVar24 = uVar31;
    if (uVar26 < uVar31) {
      uVar24 = uVar26;
    }
    if (uVar24 != 0) {
      memcpy(dst,cctx->outBuff + sVar19,uVar24);
      sVar19 = cctx->outBuffFlushedSize;
    }
    dst = dst + uVar24;
    cctx->outBuffFlushedSize = sVar19 + uVar24;
    if (uVar26 < uVar31) {
      bVar32 = dst != pcVar30;
      dst = pcVar30;
      if (bVar32) {
        __assert_fail("op==oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3971,
                      "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                     );
      }
      goto LAB_00150a7f;
    }
    cctx->outBuffContentSize = 0;
    cctx->outBuffFlushedSize = 0;
    if (cctx->frameEnded != 0) goto LAB_00150a67;
    cctx->streamStage = zcss_load;
    ZVar18 = zcss_load;
  } while( true );
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, GENERIC);
    RETURN_ERROR_IF(input->pos  > input->size, GENERIC);
    assert(cctx!=NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        ZSTD_CCtx_params params = cctx->requestedParams;
        ZSTD_prefixDict const prefixDict = cctx->prefixDict;
        FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) ); /* Init the local dict if present. */
        memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
        assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
        DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
        if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = input->size + 1;  /* auto-fix pledgedSrcSize */
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &cctx->requestedParams, cctx->pledgedSrcSizePlusOne-1, 0 /*dictSize*/);


#ifdef ZSTD_MULTITHREAD
        if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
            params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
        }
        if (params.nbWorkers > 0) {
            /* mt context creation */
            if (cctx->mtctx == NULL) {
                DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                            params.nbWorkers);
                cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem);
                RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation);
            }
            /* mt compression */
            DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
            FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                        cctx->mtctx,
                        prefixDict.dict, prefixDict.dictSize, ZSTD_dct_rawContent,
                        cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) );
            cctx->streamStage = zcss_load;
            cctx->appliedParams.nbWorkers = params.nbWorkers;
        } else
#endif
        {   FORWARD_IF_ERROR( ZSTD_resetCStream_internal(cctx,
                            prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                            cctx->cdict,
                            params, cctx->pledgedSrcSizePlusOne-1) );
            assert(cctx->streamStage == zcss_load);
            assert(cctx->appliedParams.nbWorkers == 0);
    }   }
    /* end of transparent initialization stage */

    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        int const forceMaxProgress = (endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
        size_t flushMin;
        assert(forceMaxProgress || endOp == ZSTD_e_continue /* Protection for a new flush type */);
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        do {
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin);
        } while (forceMaxProgress && flushMin != 0 && output->pos < output->size);
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(!forceMaxProgress || flushMin == 0 || output->pos == output->size);
        return flushMin;
    }
#endif
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) );
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}